

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>>::operator()
          (FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<109u,Fixpp::Type::String>>> *this,
          FieldRef<Fixpp::TagT<109U,_Fixpp::Type::String>_> *field,ParsingContext *context,
          TagSet<Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>
          *param_3,bool param_4,bool param_5)

{
  StreamCursor *cursor;
  long lVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  cursor = context->cursor;
  lVar1 = *(long *)&cursor->buf->field_0x8;
  pcVar2 = *(char **)&cursor->buf->field_0x10;
  bVar5 = match_until_fast('|',cursor);
  if (bVar5) {
    lVar3 = *(long *)&cursor->buf->field_0x10;
    lVar4 = *(long *)&cursor->buf->field_0x8;
    (field->m_view).first = pcVar2;
    (field->m_view).second = (lVar1 + lVar3) - (long)(pcVar2 + lVar4);
    return;
  }
  ParsingContext::setError(context,ParsingError,"Expected value after tag %d, got EOF",0x6d);
  return;
}

Assistant:

void operator()(Field& field,
                            ParsingContext& context, TagSet&, bool, bool)
            {
                static constexpr auto Tag = Field::Tag::Id;
                auto& cursor = context.cursor;

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", Tag);

                auto view = valueToken.view();

                field.set(view);
            }